

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O2

SRes crnlib::LzmaEnc_MemEncode
               (CLzmaEncHandle pp,Byte *dest,SizeT *destLen,Byte *src,SizeT srcLen,int writeEndMark,
               ICompressProgress *progress,ISzAlloc *alloc,ISzAlloc *allocBig)

{
  SRes SVar1;
  CSeqOutStreamBuf outStream;
  
  *(code **)((long)pp + 0x3d360) = MyRead;
  *(Byte **)((long)pp + 0x3d368) = src;
  *(SizeT *)((long)pp + 0x3d370) = srcLen;
  outStream.funcTable.Write = MyWrite;
  outStream.rem = *destLen;
  outStream.overflow = 0;
  *(int *)((long)pp + 0x3d330) = writeEndMark;
  outStream.data = dest;
  SVar1 = LzmaEnc_Encode(pp,&outStream.funcTable,(ISeqInStream *)((long)pp + 0x3d360),progress,alloc
                         ,allocBig);
  *destLen = *destLen - outStream.rem;
  if (outStream.overflow != 0) {
    SVar1 = 7;
  }
  return SVar1;
}

Assistant:

SRes LzmaEnc_MemEncode(CLzmaEncHandle pp, Byte* dest, SizeT* destLen, const Byte* src, SizeT srcLen,
                       int writeEndMark, ICompressProgress* progress, ISzAlloc* alloc, ISzAlloc* allocBig) {
  SRes res;
  CLzmaEnc* p = (CLzmaEnc*)pp;

  CSeqOutStreamBuf outStream;

  LzmaEnc_SetInputBuf(p, src, srcLen);

  outStream.funcTable.Write = MyWrite;
  outStream.data = dest;
  outStream.rem = *destLen;
  outStream.overflow = False;

  p->writeEndMark = writeEndMark;
  res = LzmaEnc_Encode(pp, &outStream.funcTable, &p->seqBufInStream.funcTable,
                       progress, alloc, allocBig);

  *destLen -= outStream.rem;
  if (outStream.overflow)
    return SZ_ERROR_OUTPUT_EOF;
  return res;
}